

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O2

void Allocations::validateOverlap(void)

{
  int64_t iVar1;
  int64_t iVar2;
  _Base_ptr p_Var3;
  long lVar4;
  long lVar5;
  char *text;
  ulong uVar6;
  long local_78;
  long lStack_70;
  pair<const_Allocations::Key,_Allocations::Usage> it;
  
  local_78 = -1;
  lStack_70 = -1;
  lVar4 = -1;
  uVar6 = 0;
  lVar5 = 0;
  p_Var3 = allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &allocations._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    it.first.fileID = *(int64_t *)(p_Var3 + 1);
    it.first.position = (int64_t)p_Var3[1]._M_parent;
    it.second.space = (int64_t)p_Var3[1]._M_left;
    it.second.usage = (int64_t)p_Var3[1]._M_right;
    it.second._16_8_ = *(undefined8 *)(p_Var3 + 2);
    if (it.first.fileID == local_78) {
      if ((it.first.position <= lStack_70) || (lVar4 <= it.first.position)) goto LAB_00167f76;
      text = "Content of areas %08llX and %08llx overlap";
      if ((it.first.position < lStack_70 + lVar5) ||
         ((it.second.usesFill == true &&
          (text = "Areas %08llX and %08llx overlap and both fill", (uVar6 & 1) != 0)))) {
        Logger::queueError<long,long>(Warning,text,&lStack_70,&it.first.position);
      }
      if (lVar4 <= it.second.space + it.first.position) goto LAB_00167f76;
      lVar5 = it.second.usage + it.first.position;
      iVar1 = getSubAreaUsage(it.first.fileID,it.first.position);
      lVar5 = (iVar1 + lVar5) - lStack_70;
    }
    else {
LAB_00167f76:
      iVar1 = it.second.usage;
      local_78 = it.first.fileID;
      lStack_70 = it.first.position;
      uVar6 = it.second._16_8_ & 0xff;
      iVar2 = getSubAreaUsage(it.first.fileID,it.first.position);
      lVar5 = iVar2 + iVar1;
      lVar4 = it.second.space + it.first.position;
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

void Allocations::validateOverlap()
{
	// An easy mistake to make is a "subarea" where the parent area fills, and erases the subarea.
	// Let's detect any sort of area overlap and report a warning.
	Key lastKey{ -1, -1 };
	int64_t lastEndPosition = -1;
	Usage lastUsage{};

	for (auto it : allocations) {
		if (it.first.fileID == lastKey.fileID && it.first.position > lastKey.position && it.first.position < lastEndPosition) {
			// First, the obvious: does the content overlap?
			if (it.first.position < lastKey.position + lastUsage.usage)
				Logger::queueError(Logger::Warning, "Content of areas %08llX and %08llx overlap", lastKey.position, it.first.position);
			// Next question, does the earlier one fill?
			else if (it.second.usesFill && lastUsage.usesFill)
				Logger::queueError(Logger::Warning, "Areas %08llX and %08llx overlap and both fill", lastKey.position, it.first.position);

			// If the new area ends before the last, keep it as the last.
			if (lastEndPosition > it.first.position + it.second.space) {
				// But update the usage to the max position.
				int64_t newUsageEnd = it.first.position + it.second.usage + getSubAreaUsage(it.first);
				lastUsage.usage = newUsageEnd - lastKey.position;
				continue;
			}
		}

		lastKey = it.first;
		lastUsage = it.second;
		lastUsage.usage += getSubAreaUsage(lastKey);
		lastEndPosition = it.first.position + it.second.space;
	}
}